

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReader::Level::Level(Level *this,int nfaces)

{
  size_type __n;
  vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
  *this_00;
  int in_ESI;
  long in_RDI;
  allocator_type *in_stack_ffffffffffffffa0;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffa8;
  vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
  *in_stack_ffffffffffffffb0;
  allocator_type local_1e [18];
  int local_c;
  
  local_c = in_ESI;
  std::allocator<Ptex::v2_2::FaceDataHeader>::allocator
            ((allocator<Ptex::v2_2::FaceDataHeader> *)0x82dbb5);
  std::vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::vector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator_type *)in_stack_ffffffffffffffa0);
  std::allocator<Ptex::v2_2::FaceDataHeader>::~allocator
            ((allocator<Ptex::v2_2::FaceDataHeader> *)0x82dbd5);
  __n = in_RDI + 0x18;
  this_00 = (vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
             *)(long)local_c;
  std::allocator<long>::allocator((allocator<long> *)0x82dbfc);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)this_00,__n,in_stack_ffffffffffffffa0);
  std::allocator<long>::~allocator((allocator<long> *)0x82dc1c);
  __a = local_1e;
  std::allocator<Ptex::v2_2::PtexReader::FaceData_*>::allocator
            ((allocator<Ptex::v2_2::PtexReader::FaceData_*> *)0x82dc43);
  std::
  vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>::
  vector(this_00,__n,__a);
  std::allocator<Ptex::v2_2::PtexReader::FaceData_*>::~allocator
            ((allocator<Ptex::v2_2::PtexReader::FaceData_*> *)0x82dc63);
  return;
}

Assistant:

Level(int nfaces)
            : fdh(nfaces),
              offsets(nfaces),
              faces(nfaces) {}